

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_find_files.cpp
# Opt level: O0

bool __thiscall
crnlib::find_files::find(find_files *this,char *pBasepath,char *pFilespec,uint flags)

{
  bool bVar1;
  uint flags_local;
  char *pFilespec_local;
  char *pBasepath_local;
  find_files *this_local;
  
  vector<crnlib::find_files::file_desc>::resize(&this->m_files,0,false);
  bVar1 = find_internal(this,pBasepath,"",pFilespec,flags,0);
  return bVar1;
}

Assistant:

bool find_files::find(const char* pBasepath, const char* pFilespec, uint flags)
    {
        m_files.resize(0);
        return find_internal(pBasepath, "", pFilespec, flags, 0);
    }